

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_group.cpp
# Opt level: O0

size_t __thiscall mpt::item_group::clear(item_group *this,metatype *ref)

{
  iterator piVar1;
  metatype *pmVar2;
  long lVar3;
  metatype *curr;
  item<mpt::metatype> *it;
  iterator __end1;
  iterator __begin1;
  item_array<mpt::metatype> *__range1;
  long empty;
  item_array<mpt::metatype> local_30;
  item_group *local_28;
  long remove;
  metatype *ref_local;
  item_group *this_local;
  
  local_28 = (item_group *)0x0;
  remove = (long)ref;
  ref_local = &this->super_metatype;
  if (ref == (metatype *)0x0) {
    local_28 = (item_group *)
               unique_array<mpt::item<mpt::metatype>_>::length
                         (&(this->_items).super_unique_array<mpt::item<mpt::metatype>_>);
    item_array<mpt::metatype>::item_array(&local_30,-1);
    item_array<mpt::metatype>::operator=(&this->_items,&local_30);
    item_array<mpt::metatype>::~item_array(&local_30);
    this_local = (item_group *)(ulong)(-(local_28 != (item_group *)0x0) & 1);
  }
  else {
    __range1 = (item_array<mpt::metatype> *)0x0;
    __end1 = unique_array<mpt::item<mpt::metatype>_>::begin
                       (&(this->_items).super_unique_array<mpt::item<mpt::metatype>_>);
    piVar1 = unique_array<mpt::item<mpt::metatype>_>::end
                       (&(this->_items).super_unique_array<mpt::item<mpt::metatype>_>);
    for (; __end1 != piVar1; __end1 = __end1 + 1) {
      pmVar2 = reference<mpt::metatype>::instance(&__end1->super_reference<mpt::metatype>);
      if (pmVar2 == (metatype *)0x0) {
        __range1 = (item_array<mpt::metatype> *)
                   ((long)&(__range1->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref + 1);
      }
      else if (pmVar2 == (metatype *)remove) {
        reference<mpt::metatype>::set_instance
                  (&__end1->super_reference<mpt::metatype>,(metatype *)0x0);
        local_28 = (item_group *)
                   ((long)&(local_28->super_metatype).super_convertable._vptr_convertable + 1);
      }
    }
    pmVar2 = &local_28->super_metatype;
    lVar3 = unique_array<mpt::item<mpt::metatype>_>::length
                      (&(this->_items).super_unique_array<mpt::item<mpt::metatype>_>);
    if (lVar3 / 2 <
        (long)&(__range1->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref +
        (long)&(pmVar2->super_convertable)._vptr_convertable) {
      item_array<mpt::metatype>::compact(&this->_items);
    }
    this_local = local_28;
  }
  return (size_t)this_local;
}

Assistant:

size_t item_group::clear(const metatype *ref)
{
	long remove = 0;
	if (!ref) {
		remove = _items.length();
		_items = item_array<metatype>();
		return remove ? true : false;
	}
	long empty = 0;
	for (auto &it : _items) {
		metatype *curr = it.instance();
		if (!curr) {
			++empty;
			continue;
		}
		if (curr != ref) {
			continue;
		}
		it.set_instance(nullptr);
		++remove;
	}
	if ((remove + empty) > _items.length()/2) {
		_items.compact();
	}
	return remove;
}